

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertproxymodel.cpp
# Opt level: O2

bool __thiscall
InsertProxyModel::moveRows
          (InsertProxyModel *this,QModelIndex *sourceParent,int sourceRow,int count,
          QModelIndex *destinationParent,int destinationChild)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  long lVar4;
  long *plVar5;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  bVar1 = QModelIndex::isValid(sourceParent);
  if (((!bVar1) && (bVar1 = QModelIndex::isValid(destinationParent), !bVar1)) &&
     (lVar4 = QAbstractProxyModel::sourceModel(), lVar4 != 0)) {
    plVar5 = (long *)QAbstractProxyModel::sourceModel();
    local_60 = 0xffffffffffffffff;
    local_58 = 0;
    uStack_50 = 0;
    iVar3 = (**(code **)(*plVar5 + 0x78))(plVar5);
    if (count + sourceRow <= iVar3) {
      plVar5 = (long *)QAbstractProxyModel::sourceModel();
      local_60 = 0xffffffffffffffff;
      local_58 = 0;
      uStack_50 = 0;
      iVar3 = (**(code **)(*plVar5 + 0x78))(plVar5);
      if (destinationChild <= iVar3) {
        plVar5 = (long *)QAbstractProxyModel::sourceModel();
        local_60 = 0xffffffffffffffff;
        local_48 = 0xffffffffffffffff;
        local_58 = 0;
        uStack_50 = 0;
        local_40 = 0;
        uStack_38 = 0;
        uVar2 = (**(code **)(*plVar5 + 0x118))
                          (plVar5,&local_60,sourceRow,count,&local_48,destinationChild);
        return (bool)uVar2;
      }
    }
  }
  return false;
}

Assistant:

bool InsertProxyModel::moveRows(const QModelIndex &sourceParent, int sourceRow, int count, const QModelIndex &destinationParent, int destinationChild)
{
    if (sourceParent.isValid() || destinationParent.isValid())
        return false;
    if (!sourceModel())
        return false;
    if (sourceRow + count > sourceModel()->rowCount())
        return false;
    if (destinationChild > sourceModel()->rowCount())
        return false;
    return sourceModel()->moveRows(QModelIndex(), sourceRow, count, QModelIndex(), destinationChild);
}